

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

SceneLight * __thiscall
CMU462::Application::init_light(Application *this,LightInfo *light,Matrix4x4 *transform)

{
  Matrix4x4 *transform_local;
  LightInfo *light_local;
  Application *this_local;
  
  switch(light->light_type) {
  case NONE:
  default:
    this_local = (Application *)0x0;
    break;
  case AMBIENT:
    this_local = (Application *)operator_new(0x18);
    DynamicScene::AmbientLight::AmbientLight((AmbientLight *)this_local,light);
    break;
  case DIRECTIONAL:
    this_local = (Application *)operator_new(0x30);
    DynamicScene::DirectionalLight::DirectionalLight((DirectionalLight *)this_local,light,transform)
    ;
    break;
  case AREA:
    this_local = (Application *)operator_new(0x78);
    DynamicScene::AreaLight::AreaLight((AreaLight *)this_local,light,transform);
    break;
  case POINT:
    this_local = (Application *)operator_new(0x30);
    DynamicScene::PointLight::PointLight((PointLight *)this_local,light,transform);
    break;
  case SPOT:
    this_local = (Application *)operator_new(0x48);
    DynamicScene::SpotLight::SpotLight((SpotLight *)this_local,light,transform);
  }
  return (SceneLight *)this_local;
}

Assistant:

DynamicScene::SceneLight *Application::init_light(LightInfo& light,
                                        const Matrix4x4& transform) {
  switch(light.light_type) {
    case Collada::LightType::NONE:
      break;
    case Collada::LightType::AMBIENT:
      return new DynamicScene::AmbientLight(light);
    case Collada::LightType::DIRECTIONAL:
      return new DynamicScene::DirectionalLight(light, transform);
    case Collada::LightType::AREA:
      return new DynamicScene::AreaLight(light, transform);
    case Collada::LightType::POINT:
      return new DynamicScene::PointLight(light, transform);
    case Collada::LightType::SPOT:
      return new DynamicScene::SpotLight(light, transform);
    default:
      break;
  }
  return nullptr;
}